

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O2

void StrToNumVectorHelper<std::vector<long_double,std::allocator<long_double>>>
               (string *source,vector<long_double,_std::allocator<long_double>_> *dest,
               value_type_conflict9 *def)

{
  istream *piVar1;
  double dVar2;
  string item;
  longdouble local_1c8;
  stringstream ss;
  
  if (*(long *)(dest + 8) != *(long *)dest) {
    *(long *)(dest + 8) = *(long *)dest;
  }
  if (source->_M_string_length != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)source,_S_out|_S_in);
    item._M_dataplus._M_p = (pointer)&item.field_2;
    item._M_string_length = 0;
    item.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ss,(string *)&item,',');
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      local_1c8 = (longdouble)CONCAT91(local_1c8._1_9_,0x20);
      std::
      __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )item._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(item._M_dataplus._M_p + item._M_string_length),
                 (_Iter_equals_val<const_char>)&local_1c8);
      dVar2 = strtod(item._M_dataplus._M_p,(char **)0x0);
      local_1c8 = (longdouble)dVar2;
      std::vector<long_double,_std::allocator<long_double>_>::emplace_back<long_double>
                (dest,&local_1c8);
    }
    if (*(long *)dest == *(long *)(dest + 8)) {
      std::vector<long_double,_std::allocator<long_double>_>::push_back(dest,def);
    }
    std::__cxx11::string::~string((string *)&item);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  std::vector<long_double,_std::allocator<long_double>_>::push_back(dest,def);
  return;
}

Assistant:

inline void StrToNumVectorHelper(const std::string &source, TList &dest, const typename TList::value_type &def)
{
    typedef typename TList::value_type T;
    dest.clear();

    if(!source.empty())
    {
        std::stringstream ss(source);
        std::string item;
        while(std::getline(ss, item, ','))
        {
            auto remove_ret = std::remove(item.begin(), item.end(), ' '); //-V530
            (void)remove_ret;

            try
            {
                if(std::is_same<T, int>::value ||
                   std::is_same<T, long>::value ||
                   std::is_same<T, short>::value)
                    dest.push_back(static_cast<T>(std::strtol(item.c_str(), NULL, 0)));
                else if(std::is_same<T, unsigned int>::value ||
                        std::is_same<T, unsigned long>::value ||
                        std::is_same<T, unsigned short>::value)
                    dest.push_back(static_cast<T>(std::strtoul(item.c_str(), NULL, 0)));
                else if(std::is_same<T, float>::value)
                    dest.push_back(std::strtof(item.c_str(), NULL));
                else
                    dest.push_back(std::strtod(item.c_str(), NULL));
            }
            catch(...)
            {
                dest.pop_back();
            }
        }

        if(dest.empty())
            dest.push_back(def);
    }
    else
        dest.push_back(def);
}